

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall CVmPackType::CVmPackType(CVmPackType *this,CVmPackGroup *g)

{
  CVmPackPos *in_RSI;
  undefined4 *in_RDI;
  
  CVmPackPos::CVmPackPos(in_RSI);
  *in_RDI = 0;
  in_RDI[9] = 0xffffffff;
  in_RDI[0xb] = 0;
  in_RDI[10] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[8] = *(undefined4 *)((long)&in_RSI->len + 4);
  in_RDI[0xe] = in_RSI->idx;
  in_RDI[0xf] = *(undefined4 *)&in_RSI->field_0x14;
  return;
}

Assistant:

CVmPackType::CVmPackType(const CVmPackGroup *g)
{
    /* clear the type code and count */
    type_code = 0;
    count = ITER_NONE;
    count_as_type = 0;
    count_in_bytes = FALSE;
    bang = FALSE;
    qu = FALSE;
    null_term = FALSE;

    /* inherit group attributes */
    big_endian = g->big_endian;
    tilde = g->tilde;
    pct = g->pct;
}